

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  pointer piVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer *__ptr;
  char *pcVar6;
  float fVar7;
  AssertionResult gtest_ar_2;
  size_type kSize;
  pair<google::dense_hashtable_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p;
  hasher local_f8;
  Hasher local_e8;
  pair<google::dense_hashtable_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_d8;
  unsigned_long local_b8;
  undefined1 local_b0 [8];
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  
  local_b8 = 0x400;
  *(undefined8 *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.settings + 0x20) = 0x3f4ccccd;
  fVar7 = (float)(this->
                 super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_buckets * 0.8;
  uVar5 = (ulong)fVar7;
  *(ulong *)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.settings + 0x10) =
       (long)(fVar7 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  *(size_type *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.settings + 0x18) = 0;
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x28) = false;
  iVar3 = UniqueObjectHelper<int>(0x396);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0xc) = iVar3;
  iVar3 = 1;
  do {
    iVar4 = UniqueObjectHelper<int>(iVar3);
    local_d8.first.ht =
         (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)CONCAT44(local_d8.first.ht._4_4_,iVar4);
    google::
    dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<int_const&,int_const&>
              ((pair<google::dense_hashtable_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)local_b0,
               (dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this_00,(int *)&local_d8,(int *)&local_d8);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x334);
  local_d8.first.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)(this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b0,"kSize","this->ht_.bucket_count()",&local_b8,
             (unsigned_long *)&local_d8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((pointer)local_a8.settings.
                 super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                 super_TransparentHasher.super_Hasher._0_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_a8.settings.
                         super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                         super_TransparentHasher.super_Hasher._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5ac,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_d8.first.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d8.first.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar2 = local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          super_TransparentHasher.super_Hasher._0_8_;
  if ((pointer)local_a8.settings.
               super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
               super_TransparentHasher.super_Hasher._0_8_ != (pointer)0x0) {
    if (*(pointer *)
         local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
         super_TransparentHasher.super_Hasher._0_8_ !=
        (pointer)(local_a8.settings.
                  super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                  super_TransparentHasher.super_Hasher._0_8_ + 0x10)) {
      operator_delete(*(pointer *)
                       local_a8.settings.
                       super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                       super_TransparentHasher.super_Hasher._0_8_);
    }
    operator_delete((void *)uVar2);
  }
  iVar3 = 0x400;
  do {
    iVar4 = UniqueObjectHelper<int>(0x332);
    local_b0._0_4_ = iVar4;
    google::
    dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&this_00->rep,(key_type *)local_b0);
    iVar4 = UniqueObjectHelper<int>(0x332);
    local_d8.first.ht =
         (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)CONCAT44(local_d8.first.ht._4_4_,iVar4);
    google::
    dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<int_const&,int_const&>
              ((pair<google::dense_hashtable_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)local_b0,
               (dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this_00,(int *)&local_d8,(int *)&local_d8);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_d8.first.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_d8.first.ht & 0xffffffff00000000);
  local_f8.super_Hasher.id_ = 2;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)local_b0,"this->ht_.num_table_copies()","pre_copies + 2",(int *)&local_d8,
             (int *)&local_f8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((pointer)local_a8.settings.
                 super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                 super_TransparentHasher.super_Hasher._0_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_a8.settings.
                         super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                         super_TransparentHasher.super_Hasher._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5b5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_d8.first.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d8.first.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  if ((pointer)local_a8.settings.
               super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
               super_TransparentHasher.super_Hasher._0_8_ != (pointer)0x0) {
    if (*(pointer *)
         local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
         super_TransparentHasher.super_Hasher._0_8_ !=
        (pointer)(local_a8.settings.
                  super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                  super_TransparentHasher.super_Hasher._0_8_ + 0x10)) {
      operator_delete(*(pointer *)
                       local_a8.settings.
                       super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                       super_TransparentHasher.super_Hasher._0_8_);
    }
    operator_delete((void *)local_a8.settings.
                            super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                            super_TransparentHasher.super_Hasher._0_8_);
  }
  local_f8.super_Hasher._0_8_ = (AssertHelperData *)0x0;
  local_f8.super_Hasher.num_compares_ = 0;
  local_e8.id_ = 0;
  local_e8.num_hashes_ = 0;
  local_e8.num_compares_ = 0;
  local_d8.first.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_d8.first.ht & 0xffffffff00000000);
  local_d8.first.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_b0,0,&local_f8,(key_equal *)&local_e8,(allocator_type *)&local_d8);
  iVar3 = UniqueObjectHelper<int>(0x396);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_a8);
  local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = true;
  local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_factor_ = 0.8;
  local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = (size_type)((float)local_a8.num_buckets * 0.8);
  local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ =
       (long)((float)local_a8.num_buckets * 0.8 - 9.223372e+18) &
       (long)local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>
             .enlarge_threshold_ >> 0x3f |
       local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
       enlarge_threshold_;
  local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = 0;
  local_a8.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  local_f8.super_Hasher.id_ = (undefined4)local_a8.num_buckets;
  local_f8.super_Hasher.num_hashes_ = local_a8.num_buckets._4_4_;
  local_a8.key_info.delkey = iVar3;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((internal *)&local_d8,"ht2.bucket_count()","kSize",(unsigned_long *)&local_f8,&local_b8
            );
  if ((char)local_d8.first.ht == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (local_d8.first.pos == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_d8.first.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5be,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((AssertHelperData *)local_f8.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.super_Hasher._0_8_ + 8))();
    }
  }
  piVar1 = local_d8.first.pos;
  if (local_d8.first.pos != (pointer)0x0) {
    if (*(pointer *)local_d8.first.pos != local_d8.first.pos + 4) {
      operator_delete(*(pointer *)local_d8.first.pos);
    }
    operator_delete(piVar1);
  }
  iVar3 = 1;
  do {
    iVar4 = UniqueObjectHelper<int>(iVar3);
    local_f8.super_Hasher.id_ = iVar4;
    google::
    dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_a8,1);
    google::
    dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<int_const&,int_const&>
              (&local_d8,
               (dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)&local_a8,(int *)&local_f8,(int *)&local_f8);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x334);
  local_f8.super_Hasher.id_ = (undefined4)local_a8.num_buckets;
  local_f8.super_Hasher.num_hashes_ = local_a8.num_buckets._4_4_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_d8,"ht2.bucket_count()","kSize",(unsigned_long *)&local_f8,&local_b8
            );
  if ((char)local_d8.first.ht == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (local_d8.first.pos == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_d8.first.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((AssertHelperData *)local_f8.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.super_Hasher._0_8_ + 8))();
    }
  }
  piVar1 = local_d8.first.pos;
  if (local_d8.first.pos != (pointer)0x0) {
    if (*(pointer *)local_d8.first.pos != local_d8.first.pos + 4) {
      operator_delete(*(pointer *)local_d8.first.pos);
    }
    operator_delete(piVar1);
  }
  iVar3 = 1;
  do {
    iVar4 = UniqueObjectHelper<int>(iVar3);
    local_d8.first.ht =
         (dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)CONCAT44(local_d8.first.ht._4_4_,iVar4);
    google::
    dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&local_a8,(key_type *)&local_d8);
    local_f8.super_Hasher.id_ = (undefined4)local_a8.num_buckets;
    local_f8.super_Hasher.num_hashes_ = local_a8.num_buckets._4_4_;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_d8,"ht2.bucket_count()","kSize",(unsigned_long *)&local_f8,
               &local_b8);
    if ((char)local_d8.first.ht == '\0') {
      testing::Message::Message((Message *)&local_f8);
      pcVar6 = "";
      if (local_d8.first.pos != (pointer)0x0) {
        pcVar6 = *(char **)local_d8.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x5c5,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((AssertHelperData *)local_f8.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_f8.super_Hasher._0_8_ + 8))();
      }
    }
    piVar1 = local_d8.first.pos;
    if (local_d8.first.pos != (pointer)0x0) {
      if (*(pointer *)local_d8.first.pos != local_d8.first.pos + 4) {
        operator_delete(*(pointer *)local_d8.first.pos);
      }
      operator_delete(piVar1);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x334);
  iVar3 = UniqueObjectHelper<int>(0x334);
  local_f8.super_Hasher.id_ = iVar3;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_a8,1);
  google::
  dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<int_const&,int_const&>
            (&local_d8,
             (dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_a8,(int *)&local_f8,(int *)&local_f8);
  local_f8.super_Hasher.id_ = (undefined4)local_a8.num_buckets;
  local_f8.super_Hasher.num_hashes_ = local_a8.num_buckets._4_4_;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&local_d8,"ht2.bucket_count()","kSize",(unsigned_long *)&local_f8,&local_b8
            );
  if ((char)local_d8.first.ht == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (local_d8.first.pos == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_d8.first.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((AssertHelperData *)local_f8.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.super_Hasher._0_8_ + 8))();
    }
  }
  piVar1 = local_d8.first.pos;
  if (local_d8.first.pos != (pointer)0x0) {
    if (*(pointer *)local_d8.first.pos != local_d8.first.pos + 4) {
      operator_delete(*(pointer *)local_d8.first.pos);
    }
    operator_delete(piVar1);
  }
  local_b0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c24338;
  if (local_a8.table != (pointer)0x0) {
    free(local_a8.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}